

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O1

void __thiscall vigra::BmpEncoder::setNumBands(BmpEncoder *this,uint bands)

{
  PreconditionViolation *this_00;
  
  if (this->pimpl->finalized == true) {
    this_00 = (PreconditionViolation *)__cxa_allocate_exception(0x28);
    PreconditionViolation::PreconditionViolation
              (this_00,"encoder settings were already finalized",
               "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/bmp.cxx"
               ,0x425);
  }
  else {
    if ((bands | 2) == 3) {
      this->pimpl->grayscale = bands == 1;
      return;
    }
    this_00 = (PreconditionViolation *)__cxa_allocate_exception(0x28);
    PreconditionViolation::PreconditionViolation
              (this_00,"bmp supports only rgb and grayscale images",
               "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/bmp.cxx"
               ,0x427);
  }
  __cxa_throw(this_00,&PreconditionViolation::typeinfo,ContractViolation::~ContractViolation);
}

Assistant:

void BmpEncoder::setNumBands( unsigned int bands )
{
    VIGRA_IMPEX_FINALIZED(pimpl->finalized);
    vigra_precondition( ( bands == 1 ) || ( bands == 3 ),
                        "bmp supports only rgb and grayscale images" );
    pimpl->grayscale = ( bands == 1 );
}